

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool ON_RTree::Search(ON_RTree *a_rtreeA,ON_RTree *a_rtreeB,double tolerance,
                     ON_SimpleArray<ON_2dex> *a_result)

{
  bool bVar1;
  double local_48;
  undefined1 local_40 [8];
  ON_RTreePairSearchResult r;
  ON_SimpleArray<ON_2dex> *a_result_local;
  double tolerance_local;
  ON_RTree *a_rtreeB_local;
  ON_RTree *a_rtreeA_local;
  
  if (a_rtreeA->m_root == (ON_RTreeNode *)0x0) {
    a_rtreeA_local._7_1_ = false;
  }
  else if (a_rtreeB->m_root == (ON_RTreeNode *)0x0) {
    a_rtreeA_local._7_1_ = false;
  }
  else {
    r.m_result = a_result;
    bVar1 = ON_IsValid(tolerance);
    if ((!bVar1) || (local_48 = tolerance, tolerance <= 0.0)) {
      local_48 = 0.0;
    }
    local_40 = (undefined1  [8])local_48;
    r.m_tolerance = (double)r.m_result;
    PairSearchHelper(a_rtreeA->m_root,a_rtreeB->m_root,(ON_RTreePairSearchResult *)local_40);
    a_rtreeA_local._7_1_ = true;
  }
  return a_rtreeA_local._7_1_;
}

Assistant:

bool ON_RTree::Search( 
          const ON_RTree& a_rtreeA,
          const ON_RTree& a_rtreeB, 
          double tolerance,
          ON_SimpleArray<ON_2dex>& a_result
          )
{
  if ( 0 == a_rtreeA.m_root )
    return false;
  if ( 0 == a_rtreeB.m_root )
    return false;
  ON_RTreePairSearchResult r;
  r.m_tolerance = (ON_IsValid(tolerance) && tolerance > 0.0) ? tolerance : 0.0;
  r.m_result = &a_result;
  PairSearchHelper(a_rtreeA.m_root,a_rtreeB.m_root,&r);
  return true;
}